

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_quaternion rf_quaternion_normalize(rf_quaternion q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  rf_quaternion rVar7;
  
  fVar2 = q.x;
  fVar3 = q.y;
  fVar4 = q.z;
  fVar6 = q.w;
  fVar5 = SQRT(fVar6 * fVar6 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  rVar7.x = fVar2 * fVar5;
  rVar7.y = fVar3 * fVar5;
  rVar7.w = fVar6 * fVar5;
  rVar7.z = fVar4 * fVar5;
  return rVar7;
}

Assistant:

RF_API rf_quaternion rf_quaternion_normalize(rf_quaternion q)
{
    rf_quaternion result = {0};

    float length, ilength;
    length = rf_quaternion_len(q);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f / length;

    result.x = q.x * ilength;
    result.y = q.y * ilength;
    result.z = q.z * ilength;
    result.w = q.w * ilength;

    return result;
}